

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.hpp
# Opt level: O0

void __thiscall
Diligent::TextureBase<Diligent::EngineGLImplTraits>::CreateDefaultViews
          (TextureBase<Diligent::EngineGLImplTraits> *this)

{
  int iVar1;
  BIND_FLAGS BVar2;
  Char *pCVar3;
  IMemoryAllocator *pIVar4;
  undefined4 extraout_var;
  char (*Args_1) [27];
  undefined1 local_a0 [8];
  string msg_1;
  anon_class_40_5_9f9a65d9 CreateDefaultView;
  Uint8 ViewIdx;
  TextureFormatAttribs *TexFmtAttribs;
  TextureViewImplType **ppDefaultViews;
  Uint32 NumDefaultViews;
  undefined1 local_30 [8];
  string msg;
  TextureBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._8_8_ = this;
  if (this->m_pDefaultViews != (void *)0x0) {
    FormatString<char[44]>
              ((string *)local_30,(char (*) [44])"Default views have already been initialized");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CreateDefaultViews",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0xb8);
    std::__cxx11::string::~string((string *)local_30);
  }
  if (((this->
       super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
       ).m_Desc.Format != TEX_FORMAT_UNKNOWN) &&
     (ppDefaultViews._0_4_ = GetNumDefaultViews(this), (Uint32)ppDefaultViews != 0)) {
    if (1 < (Uint32)ppDefaultViews) {
      pIVar4 = GetRawAllocator();
      iVar1 = (**pIVar4->_vptr_IMemoryAllocator)
                        (pIVar4,(ulong)(Uint32)ppDefaultViews << 3,"Default texture view array",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
                         ,0xc6);
      this->m_pDefaultViews = (void *)CONCAT44(extraout_var,iVar1);
      memset(this->m_pDefaultViews,0,(ulong)(Uint32)ppDefaultViews << 3);
    }
    TexFmtAttribs = (TextureFormatAttribs *)GetDefaultViewsArrayPtr(this);
    msg_1.field_2._8_8_ =
         GetTextureFormatAttribs
                   ((this->
                    super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                    ).m_Desc.Format);
    CreateDefaultView.ppDefaultViews._7_1_ = 0;
    CreateDefaultView.this =
         (TextureBase<Diligent::EngineGLImplTraits> *)((long)&CreateDefaultView.ppDefaultViews + 7);
    CreateDefaultView.ViewIdx = (Uint8 *)&ppDefaultViews;
    Args_1 = (char (*) [27])&TexFmtAttribs;
    CreateDefaultView.TexFmtAttribs = (TextureFormatAttribs *)this;
    CreateDefaultView.NumDefaultViews = (Uint32 *)Args_1;
    BVar2 = Diligent::operator&((this->
                                super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                                ).m_Desc.BindFlags,BIND_SHADER_RESOURCE);
    if (BVar2 != BIND_NONE) {
      CreateDefaultViews::anon_class_40_5_9f9a65d9::operator()
                ((anon_class_40_5_9f9a65d9 *)((long)&msg_1.field_2 + 8),TEXTURE_VIEW_SHADER_RESOURCE
                );
    }
    BVar2 = Diligent::operator&((this->
                                super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                                ).m_Desc.BindFlags,BIND_RENDER_TARGET);
    if (BVar2 != BIND_NONE) {
      CreateDefaultViews::anon_class_40_5_9f9a65d9::operator()
                ((anon_class_40_5_9f9a65d9 *)((long)&msg_1.field_2 + 8),TEXTURE_VIEW_RENDER_TARGET);
    }
    BVar2 = Diligent::operator&((this->
                                super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                                ).m_Desc.BindFlags,BIND_DEPTH_STENCIL);
    if (BVar2 != BIND_NONE) {
      CreateDefaultViews::anon_class_40_5_9f9a65d9::operator()
                ((anon_class_40_5_9f9a65d9 *)((long)&msg_1.field_2 + 8),TEXTURE_VIEW_DEPTH_STENCIL);
    }
    BVar2 = Diligent::operator&((this->
                                super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                                ).m_Desc.BindFlags,BIND_UNORDERED_ACCESS);
    if (BVar2 != BIND_NONE) {
      CreateDefaultViews::anon_class_40_5_9f9a65d9::operator()
                ((anon_class_40_5_9f9a65d9 *)((long)&msg_1.field_2 + 8),
                 TEXTURE_VIEW_UNORDERED_ACCESS);
    }
    BVar2 = Diligent::operator&((this->
                                super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                                ).m_Desc.BindFlags,BIND_FLAG_LAST);
    if (BVar2 != BIND_NONE) {
      CreateDefaultViews::anon_class_40_5_9f9a65d9::operator()
                ((anon_class_40_5_9f9a65d9 *)((long)&msg_1.field_2 + 8),TEXTURE_VIEW_SHADING_RATE);
    }
    if (CreateDefaultView.ppDefaultViews._7_1_ != (Uint32)ppDefaultViews) {
      FormatString<char[26],char[27]>
                ((string *)local_a0,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"ViewIdx == NumDefaultViews",Args_1);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"CreateDefaultViews",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
                 ,0x123);
      std::__cxx11::string::~string((string *)local_a0);
    }
  }
  return;
}

Assistant:

void CreateDefaultViews()
    {
        VERIFY(m_pDefaultViews == nullptr, "Default views have already been initialized");

        if (this->m_Desc.Format == TEX_FORMAT_UNKNOWN)
        {
            // Happens when creating dummy OpenGL textures
            return;
        }

        const Uint32 NumDefaultViews = GetNumDefaultViews();
        if (NumDefaultViews == 0)
            return;

        if (NumDefaultViews > 1)
        {
            m_pDefaultViews = ALLOCATE(GetRawAllocator(), "Default texture view array", TextureViewImplType*, NumDefaultViews);
            memset(m_pDefaultViews, 0, sizeof(TextureViewImplType*) * NumDefaultViews);
        }
        TextureViewImplType** ppDefaultViews = GetDefaultViewsArrayPtr();

        const TextureFormatAttribs& TexFmtAttribs = GetTextureFormatAttribs(this->m_Desc.Format);

        Uint8 ViewIdx = 0;

        auto CreateDefaultView = [&](TEXTURE_VIEW_TYPE ViewType) //
        {
            TextureViewDesc ViewDesc;
            ViewDesc.ViewType = ViewType;

            if (TexFmtAttribs.IsTypeless)
            {
                ViewDesc.Format = GetDefaultTextureViewFormat(this->m_Desc, ViewType);
                if (ViewDesc.Format == TEX_FORMAT_UNKNOWN)
                {
                    return;
                }
            }

            std::string ViewName;
            switch (ViewType)
            {
                case TEXTURE_VIEW_SHADER_RESOURCE:
                    if ((this->m_Desc.MiscFlags & MISC_TEXTURE_FLAG_GENERATE_MIPS) != 0)
                        ViewDesc.Flags |= TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION;
                    ViewName = "Default SRV of texture '";
                    break;

                case TEXTURE_VIEW_RENDER_TARGET:
                    ViewName = "Default RTV of texture '";
                    break;

                case TEXTURE_VIEW_DEPTH_STENCIL:
                    ViewName = "Default DSV of texture '";
                    break;

                case TEXTURE_VIEW_UNORDERED_ACCESS:
                    ViewDesc.AccessFlags = UAV_ACCESS_FLAG_READ_WRITE;

                    ViewName = "Default UAV of texture '";
                    break;

                case TEXTURE_VIEW_SHADING_RATE:
                    ViewDesc.AccessFlags = UAV_ACCESS_FLAG_READ_WRITE;

                    ViewName = "Default VRS view of texture '";
                    break;

                default:
                    UNEXPECTED("Unexpected texture type");
            }
            ViewName += this->m_Desc.Name;
            ViewName += '\'';
            ViewDesc.Name = ViewName.c_str();

            VERIFY_EXPR(ViewIdx < NumDefaultViews);
            TextureViewImplType*& pView = ppDefaultViews[ViewIdx];
            CreateViewInternal(ViewDesc, reinterpret_cast<ITextureView**>(&pView), true);
            DEV_CHECK_ERR(pView != nullptr, "Failed to create default view for texture '", this->m_Desc.Name, "'.");
            DEV_CHECK_ERR(pView->GetDesc().ViewType == ViewType, "Unexpected view type.");

            m_ViewIndices[ViewType] = ViewIdx++;
        };

        if (this->m_Desc.BindFlags & BIND_SHADER_RESOURCE)
        {
            CreateDefaultView(TEXTURE_VIEW_SHADER_RESOURCE);
        }

        if (this->m_Desc.BindFlags & BIND_RENDER_TARGET)
        {
            CreateDefaultView(TEXTURE_VIEW_RENDER_TARGET);
        }

        if (this->m_Desc.BindFlags & BIND_DEPTH_STENCIL)
        {
            CreateDefaultView(TEXTURE_VIEW_DEPTH_STENCIL);
        }

        if (this->m_Desc.BindFlags & BIND_UNORDERED_ACCESS)
        {
            CreateDefaultView(TEXTURE_VIEW_UNORDERED_ACCESS);
        }

        if (this->m_Desc.BindFlags & BIND_SHADING_RATE)
        {
            CreateDefaultView(TEXTURE_VIEW_SHADING_RATE);
        }

        VERIFY_EXPR(ViewIdx == NumDefaultViews);
    }